

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socksd.c
# Opt level: O2

int main(int argc,char **argv)

{
  uchar uVar1;
  byte bVar2;
  unsigned_short connectport;
  uint __i;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  int *piVar8;
  char *pcVar9;
  uint *puVar10;
  long lVar11;
  FILE *__stream;
  ssize_t sVar12;
  size_t sVar13;
  ushort connectport_00;
  ulong uVar14;
  socklen_t __len;
  char cVar15;
  undefined8 uVar16;
  char *msg;
  int iVar17;
  uint uVar18;
  char *pcVar19;
  ulong uVar20;
  uint uVar21;
  uchar uVar22;
  char *local_670;
  ulong local_668;
  undefined8 local_660;
  long local_658 [2];
  uint local_648 [2];
  ulong auStack_640 [5];
  char local_618 [32];
  char key [32];
  uchar buffer [272];
  curl_socklen_t la_size;
  char *endptr;
  char acStack_440 [8];
  undefined4 uStack_438;
  undefined4 local_434;
  undefined4 uStack_430;
  int flag;
  undefined2 local_244 [138];
  fd_set fds_err;
  fd_set fds_write;
  
  pcVar19 = ".socksd.pid";
  iVar3 = 1;
LAB_00104c43:
  iVar17 = iVar3;
  if (iVar17 < argc) {
    pcVar9 = argv[iVar17];
    iVar3 = strcmp("--version",pcVar9);
    if (iVar3 == 0) {
      curl_mprintf("socksd IPv4%s\n","/IPv6");
      return 0;
    }
    iVar3 = strcmp("--pidfile",pcVar9);
    if (iVar3 == 0) {
      iVar3 = iVar17 + 1;
      if (iVar3 < argc) {
        pcVar19 = argv[iVar3];
        iVar3 = iVar17 + 2;
      }
    }
    else {
      iVar3 = strcmp("--config",pcVar9);
      if (iVar3 == 0) {
        iVar3 = iVar17 + 1;
        if (iVar3 < argc) {
          configfile = argv[iVar3];
          iVar3 = iVar17 + 2;
        }
      }
      else {
        iVar3 = strcmp("--backend",pcVar9);
        if (iVar3 == 0) {
          iVar3 = iVar17 + 1;
          if (iVar3 < argc) {
            backendaddr = argv[iVar3];
            iVar3 = iVar17 + 2;
          }
        }
        else {
          iVar3 = strcmp("--backendport",pcVar9);
          if (iVar3 != 0) {
            iVar3 = strcmp("--logfile",pcVar9);
            if (iVar3 == 0) {
              iVar3 = iVar17 + 1;
              if (iVar3 < argc) {
                serverlogfile = argv[iVar3];
                iVar3 = iVar17 + 2;
              }
              goto LAB_00104c43;
            }
            iVar3 = strcmp("--ipv6",pcVar9);
            if (iVar3 == 0) {
              ipv_inuse = "IPv6";
              use_ipv6 = 1;
            }
            else {
              iVar3 = strcmp("--ipv4",pcVar9);
              if (iVar3 != 0) {
                iVar3 = strcmp("--port",pcVar9);
                if (iVar3 != 0) {
                  puts(
                      "Usage: socksd [option]\n --backend [ipv4 addr]\n --backendport [TCP port]\n --config [file]\n --version\n --logfile [file]\n --pidfile [file]\n --ipv4\n --ipv6\n --bindonly\n --port [port]\n"
                      );
                  return 0;
                }
                iVar3 = iVar17 + 1;
                if (iVar3 < argc) {
                  uVar6 = strtoul(argv[iVar3],&endptr,10);
                  local_670 = (char *)CONCAT26(endptr._6_2_,
                                               CONCAT24(endptr._4_2_,
                                                        CONCAT22(endptr._2_2_,
                                                                 CONCAT11(endptr._1_1_,endptr._0_1_)
                                                                )));
                  pcVar9 = argv[iVar3];
                  sVar7 = strlen(pcVar9);
                  if ((local_670 != pcVar9 + sVar7) ||
                     (uVar6 != 0 && uVar6 - 0x10000 < 0xffffffffffff0401)) {
                    curl_mfprintf(_stderr,"socksd: invalid --port argument (%s)\n",pcVar9);
                    return 0;
                  }
                  port = curlx_ultous(uVar6);
                  iVar3 = iVar17 + 2;
                }
                goto LAB_00104c43;
              }
              ipv_inuse = "IPv4";
              use_ipv6 = 0;
            }
            iVar3 = iVar17 + 1;
            goto LAB_00104c43;
          }
          iVar3 = iVar17 + 1;
          if (iVar3 < argc) {
            iVar3 = atoi(argv[iVar3]);
            backendport = (unsigned_short)iVar3;
            iVar3 = iVar17 + 2;
          }
        }
      }
    }
    goto LAB_00104c43;
  }
  old_sighup_handler = (SIGHANDLER_T)signal(1,(__sighandler_t)0x1);
  if (old_sighup_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    logmsg("cannot install SIGHUP handler: %s",pcVar9);
  }
  old_sigpipe_handler = (SIGHANDLER_T)signal(0xd,(__sighandler_t)0x1);
  if (old_sigpipe_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    logmsg("cannot install SIGPIPE handler: %s",pcVar9);
  }
  old_sigalrm_handler = (SIGHANDLER_T)signal(0xe,(__sighandler_t)0x1);
  if (old_sigalrm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    logmsg("cannot install SIGALRM handler: %s",pcVar9);
  }
  old_sigint_handler = (SIGHANDLER_T)signal(2,exit_signal_handler);
  if (old_sigint_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    logmsg("cannot install SIGINT handler: %s",pcVar9);
  }
  else {
    siginterrupt(2,1);
  }
  uVar4 = socket((uint)use_ipv6 * 8 + 2,1,0);
  if (uVar4 == 0xffffffff) {
    puVar10 = (uint *)__errno_location();
    uVar4 = *puVar10;
    pcVar19 = strerror(uVar4);
    logmsg("Error creating socket: (%d) %s",(ulong)uVar4,pcVar19);
    goto LAB_0010516e;
  }
  flag = 1;
  iVar3 = setsockopt(uVar4,1,2,&flag,4);
  if (iVar3 == 0) {
LAB_0010508b:
    if (use_ipv6 == 0) {
      __len = 0x10;
      acStack_440[0] = '\0';
      acStack_440[1] = '\0';
      acStack_440[2] = '\0';
      acStack_440[3] = '\0';
      acStack_440[4] = '\0';
      acStack_440[5] = '\0';
      acStack_440[6] = '\0';
      acStack_440[7] = '\0';
      endptr._0_1_ = 2;
    }
    else {
      uStack_430 = 0;
      acStack_440._0_4_ = (undefined4)_in6addr_any;
      acStack_440._4_4_ = (undefined4)((ulong)_in6addr_any >> 0x20);
      uStack_438 = (undefined4)_poll;
      local_434 = (undefined4)((ulong)_poll >> 0x20);
      endptr._0_1_ = 10;
      __len = 0x1c;
    }
    endptr._6_1_ = '\0';
    endptr._7_1_ = '\0';
    endptr._4_2_ = 0;
    endptr._1_1_ = 0;
    endptr._2_2_ = port << 8 | port >> 8;
    iVar3 = bind(uVar4,(sockaddr *)&endptr,__len);
    if (iVar3 == 0) {
      if (port == 0) {
        sVar7 = 0x10;
        if (use_ipv6 != 0) {
          sVar7 = 0x1c;
        }
        la_size = (curl_socklen_t)sVar7;
        memset((sockaddr *)buffer,0,sVar7);
        iVar3 = getsockname(uVar4,(sockaddr *)buffer,&la_size);
        if (iVar3 < 0) {
          puVar10 = (uint *)__errno_location();
          uVar5 = *puVar10;
          pcVar19 = strerror(uVar5);
          pcVar9 = "getsockname() failed with error: (%d) %s";
          goto LAB_00105038;
        }
        if ((buffer._0_2_ == 10) || (buffer._0_2_ == 2)) {
          port = buffer._2_2_ << 8 | (ushort)buffer._2_2_ >> 8;
        }
        if (port == 0) {
          logmsg("Apparently getsockname() succeeded, with listener port zero.");
          logmsg("A valid reason for this failure is a binary built without");
          logmsg("proper network library linkage. This might not be the only");
          pcVar19 = "reason, but double check it before anything else.";
          goto LAB_0010507f;
        }
      }
      iVar3 = listen(uVar4,5);
      if (iVar3 == 0) {
        logmsg("Running %s version",ipv_inuse);
        logmsg("Listening on port %hu",(ulong)port);
        iVar3 = write_pidfile(pcVar19);
        if (iVar3 != 0) {
          local_660 = (long)((int)uVar4 / 0x40);
          local_668 = 1L << ((byte)uVar4 & 0x3f);
LAB_0010530a:
          auStack_640[3] = 0;
          auStack_640[4] = 0;
          auStack_640[1] = 0;
          auStack_640[2] = 0;
          local_648[0] = 0;
          local_648[1] = 0;
          auStack_640[0] = 0;
          local_658[0] = 0;
          local_658[1] = 0;
          if (got_exit_signal == 0) {
            local_670 = (char *)((ulong)local_670 & 0xffffffff00000000);
LAB_00105338:
            for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
              (&la_size + lVar11 * 2)[0] = 0;
              (&la_size + lVar11 * 2)[1] = 0;
            }
            for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
              fds_write.__fds_bits[lVar11] = 0;
            }
            for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
              fds_err.__fds_bits[lVar11] = 0;
            }
            *(ulong *)(&la_size + local_660 * 2) = *(ulong *)(&la_size + local_660 * 2) | local_668;
            uVar5 = uVar4;
            for (lVar11 = 0x18; lVar11 != 0x58; lVar11 = lVar11 + 0x20) {
              if (*(char *)((long)local_658 + lVar11) == '\x01') {
                uVar21 = *(uint *)((long)&local_660 + lVar11);
                uVar18 = *(uint *)((long)&local_660 + lVar11 + 4);
                *(ulong *)(&la_size + (long)((int)uVar18 / 0x40) * 2) =
                     *(ulong *)(&la_size + (long)((int)uVar18 / 0x40) * 2) |
                     1L << ((byte)uVar18 & 0x3f);
                if ((int)uVar5 < (int)uVar18) {
                  uVar5 = uVar18;
                }
                *(ulong *)(&la_size + (long)((int)uVar21 / 0x40) * 2) =
                     *(ulong *)(&la_size + (long)((int)uVar21 / 0x40) * 2) |
                     1L << ((byte)uVar21 & 0x3f);
                if ((int)uVar5 < (int)uVar21) {
                  uVar5 = uVar21;
                }
              }
            }
            uVar21 = 0;
            while( true ) {
              uVar18 = uVar21;
              iVar3 = select(uVar5 + 1,(fd_set *)&la_size,(fd_set *)&fds_write,(fd_set *)&fds_err,
                             (timeval *)0x0);
              if (got_exit_signal != 0) {
                logmsg("signalled to die, exiting...");
                goto LAB_0010605f;
              }
              if (iVar3 != -1) break;
              puVar10 = (uint *)__errno_location();
              uVar18 = *puVar10;
              uVar21 = 4;
              if (uVar18 != 4) goto LAB_0010603e;
            }
            if (-1 < iVar3) {
              if (((int)local_670 < 2) && ((*(ulong *)(&la_size + local_660 * 2) & local_668) != 0))
              {
                uVar5 = accept(uVar4,(sockaddr *)0x0,(socklen_t *)0x0);
                if (uVar5 == 0xffffffff) {
                  puVar10 = (uint *)__errno_location();
                  uVar5 = *puVar10;
                  strerror(uVar5);
                  logmsg("accept(%d, NULL, NULL) failed with error: (%d) %s",(ulong)uVar4,
                         (ulong)uVar5);
                  goto LAB_001058bd;
                }
                logmsg("====> Client connect, fd %d. Read config from %s",(ulong)uVar5,configfile);
                __stream = fopen64(configfile,"r");
                logmsg("Reset to defaults");
                config.version = '\x05';
                config.nmethods_min = '\x01';
                config.nmethods_max = '\x03';
                config.responseversion = '\x05';
                config.responsemethod = '\0';
                config.reqcmd = '\x01';
                config.connectrep = '\0';
                config.port = backendport;
                strcpy(config.addr,backendaddr);
                builtin_strncpy(config.user,"user",5);
                builtin_strncpy(config.password,"password",9);
                if (__stream != (FILE *)0x0) {
                  logmsg("parse config file");
LAB_0010555b:
                  do {
                    pcVar9 = fgets((char *)&endptr,0x200,__stream);
                    if (pcVar9 == (char *)0x0) goto LAB_00105809;
                    iVar3 = __isoc99_sscanf(&endptr,"%31s %31s",key);
                    uVar16 = key._0_8_;
                  } while (iVar3 != 2);
                  if (key._0_8_ == 0x6e6f6973726576) {
                    config.version = byteval(local_618);
                    logmsg("version [%d] set",(ulong)config.version);
                    goto LAB_0010555b;
                  }
                  iVar3 = bcmp(key,"nmethods_min",0xd);
                  if (iVar3 == 0) {
                    config.nmethods_min = byteval(local_618);
                    logmsg("nmethods_min [%d] set",(ulong)config.nmethods_min);
                    goto LAB_0010555b;
                  }
                  iVar3 = bcmp(key,"nmethods_max",0xd);
                  if (iVar3 == 0) {
                    config.nmethods_max = byteval(local_618);
                    logmsg("nmethods_max [%d] set",(ulong)config.nmethods_max);
                    goto LAB_0010555b;
                  }
                  if (uVar16 == 0x646e656b636162) {
                    strcpy(config.addr,local_618);
                    logmsg("backend [%s] set",0x10a626);
                    goto LAB_0010555b;
                  }
                  iVar3 = bcmp(key,"backendport",0xc);
                  if (iVar3 != 0) {
                    iVar3 = bcmp(key,"user",5);
                    if (iVar3 == 0) {
                      uVar16 = 0x10a646;
                      strcpy(config.user,local_618);
                      pcVar9 = "user [%s] set";
                    }
                    else {
                      iVar3 = bcmp(key,"password",9);
                      if (iVar3 != 0) {
                        iVar3 = bcmp(key,"method",7);
                        if (iVar3 != 0) {
                          iVar3 = bcmp(key,"response",9);
                          if (iVar3 == 0) {
                            config.connectrep = byteval(local_618);
                            uVar6 = (ulong)config.connectrep;
                            pcVar9 = "response [%d] set";
                            goto LAB_0010577d;
                          }
                          goto LAB_0010555b;
                        }
                        config.responsemethod = byteval(local_618);
                        uVar6 = (ulong)config.responsemethod;
                        pcVar9 = "method [%d] set";
                        goto LAB_0010577d;
                      }
                      uVar16 = 0x10a746;
                      strcpy(config.password,local_618);
                      pcVar9 = "password [%s] set";
                    }
                    logmsg(pcVar9,uVar16);
                    goto LAB_0010555b;
                  }
                  uVar6 = strtoul(local_618,(char **)0x0,10);
                  config.port = (unsigned_short)uVar6;
                  uVar6 = uVar6 & 0xffff;
                  pcVar9 = "backendport [%d] set";
LAB_0010577d:
                  logmsg(pcVar9,uVar6);
                  goto LAB_0010555b;
                }
                goto LAB_00105811;
              }
              goto LAB_001058bd;
            }
LAB_0010603e:
            pcVar9 = strerror(uVar18);
            logmsg("select() failed with error: (%d) %s",(ulong)uVar18,pcVar9);
            goto LAB_0010605f;
          }
          logmsg("signalled to die, exiting...");
LAB_0010605f:
          close(uVar4);
          unlink(pcVar19);
          goto LAB_0010516e;
        }
        goto LAB_00105167;
      }
      puVar10 = (uint *)__errno_location();
      uVar5 = *puVar10;
      pcVar19 = strerror(uVar5);
      pcVar9 = "listen(%d, 5) failed with error: (%d) %s";
      uVar21 = uVar4;
    }
    else {
      puVar10 = (uint *)__errno_location();
      uVar5 = *puVar10;
      uVar21 = (uint)port;
      pcVar19 = strerror(uVar5);
      pcVar9 = "Error binding socket on port %hu: (%d) %s";
    }
    logmsg(pcVar9,(ulong)uVar21,(ulong)uVar5,pcVar19);
  }
  else {
    puVar10 = (uint *)__errno_location();
    uVar5 = *puVar10;
    pcVar9 = strerror(uVar5);
    logmsg("setsockopt(SO_REUSEADDR) failed with error: (%d) %s",(ulong)uVar5,pcVar9);
    iVar3 = wait_ms(0x14);
    if (iVar3 == 0) {
      if (got_exit_signal == 0) goto LAB_0010508b;
      pcVar19 = "signalled to die, exiting...";
LAB_0010507f:
      logmsg(pcVar19);
    }
    else {
      uVar5 = *puVar10;
      pcVar19 = strerror(uVar5);
      pcVar9 = "wait_ms() failed with error: (%d) %s";
LAB_00105038:
      logmsg(pcVar9,(ulong)uVar5,pcVar19);
    }
  }
LAB_00105167:
  close(uVar4);
LAB_0010516e:
  if (old_sighup_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(1,(__sighandler_t)old_sighup_handler);
  }
  if (old_sigpipe_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xd,(__sighandler_t)old_sigpipe_handler);
  }
  if (old_sigalrm_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xe,(__sighandler_t)old_sigalrm_handler);
  }
  if (old_sigint_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(2,(__sighandler_t)old_sigint_handler);
  }
  if (got_exit_signal != 0) {
    logmsg("============> socksd exits with signal (%d)",(ulong)(uint)exit_signal);
    raise(exit_signal);
  }
  logmsg("============> socksd quits");
  return 0;
LAB_00105809:
  fclose(__stream);
LAB_00105811:
  sVar12 = recv(uVar5,buffer,0x110,0);
  logmsg("READ %d bytes",sVar12);
  loghex(buffer,sVar12);
  if (buffer[0] == '\x04') {
    if (buffer[1] == '\x01') {
      if (sVar12 < 9) {
        logmsg("SOCKS4 connect message too short: %d",sVar12);
      }
      else {
        connectport_00 = buffer._2_2_ << 8 | (ushort)buffer._2_2_ >> 8;
        if (config.port != 0) {
          connectport_00 = config.port;
        }
        uVar21 = socksconnect(connectport_00,(char *)(ulong)buffer[1]);
        endptr._1_1_ = uVar21 == 0xffffffff | 0x5a;
        endptr._0_1_ = 0;
        endptr._2_2_ = (ushort)buffer._2_4_;
        endptr._4_2_ = SUB42(buffer._2_4_,2);
        endptr._6_1_ = buffer[6];
        endptr._7_1_ = buffer[7];
        sVar12 = send(uVar5,&endptr,8,0);
        if (sVar12 == 8) {
          logmsg("Sent %d bytes",8);
          loghex((uchar *)&endptr,8);
          goto LAB_00105c0e;
        }
        logmsg("Sending SOCKS4 response failed!");
      }
      uVar21 = 0xffffffff;
    }
    else {
      logmsg("SOCKS4 CD is not 1: %d");
      uVar21 = 0xffffffff;
    }
LAB_00105c0e:
    if (uVar21 != 0xffffffff) {
      logmsg("====> Tunnel transfer");
      uVar6 = auStack_640[0] & 0xff;
      local_658[uVar6 * 4] = 0;
      local_658[uVar6 * 4 + 1] = 0;
      local_648[uVar6 * 8 + 1] = uVar5;
      local_648[uVar6 * 8] = uVar21;
      *(undefined1 *)(auStack_640 + uVar6 * 4) = 1;
      local_670 = (char *)CONCAT44(local_670._4_4_,(int)local_670 + 1);
      goto LAB_001058bd;
    }
  }
  else {
    pcVar9 = (char *)(ulong)config.version;
    if (buffer[0] != config.version) {
      msg = "VERSION byte not %d";
      goto LAB_00105a81;
    }
    if (config.nmethods_max < buffer[1] || buffer[1] < config.nmethods_min) {
      logmsg("NMETHODS byte not within %d - %d ",(ulong)config.nmethods_min,
             (ulong)config.nmethods_max);
    }
    else if (sVar12 == (ulong)buffer[1] + 2) {
      logmsg("Incoming request deemed fine!");
      flag = CONCAT22(flag._2_2_,CONCAT11(config.responsemethod,config.responseversion));
      sVar12 = send(uVar5,&flag,2,0);
      if (sVar12 == 2) {
        logmsg("Sent %d bytes",2);
        loghex((uchar *)&flag,2);
        uVar6 = recv(uVar5,buffer,0x110,0);
        logmsg("READ %d bytes",uVar6);
        loghex(buffer,uVar6);
        if (config.responsemethod == '\x02') {
          if ((long)uVar6 < 5) {
            pcVar9 = "Too short auth input: %d";
          }
          else {
            pcVar9 = (char *)(ulong)buffer[0];
            if (buffer[0] != '\x01') {
              msg = "Auth VERSION byte not 1, got %d";
              goto LAB_00105a81;
            }
            uVar14 = (ulong)buffer[1];
            if (uVar14 + 4 <= uVar6) {
              uVar20 = (ulong)buffer[uVar14 + 2];
              if (uVar6 < buffer[1] + 3 + (uint)buffer[uVar14 + 2]) {
                logmsg("Too short packet for ulen %d plen %d: %d",uVar14,uVar20);
              }
              else {
                sVar7 = strlen(config.user);
                if ((((sVar7 == uVar14) && (sVar7 = strlen(config.password), sVar7 == uVar20)) &&
                    (iVar3 = bcmp(buffer + 2,config.user,uVar14), iVar3 == 0)) &&
                   (iVar3 = bcmp(buffer + uVar14 + 3,config.password,uVar20), iVar3 == 0)) {
                  cVar15 = '\x01';
                }
                else {
                  cVar15 = '\0';
                  logmsg("mismatched credentials!");
                }
                flag = CONCAT22(flag._2_2_,CONCAT11(cVar15,1)) ^ 0x100;
                sVar12 = send(uVar5,&flag,2,0);
                if (sVar12 != 2) {
                  pcVar9 = "Sending auth response failed!";
                  goto LAB_00105c97;
                }
                logmsg("Sent %d bytes",2);
                loghex((uchar *)&flag,2);
                if (cVar15 != '\0') {
                  uVar6 = recv(uVar5,buffer,0x110,0);
                  logmsg("READ %d bytes",uVar6);
                  loghex(buffer,uVar6);
                  goto LAB_00105e23;
                }
              }
              goto LAB_00105c56;
            }
            pcVar9 = "Too short packet for username: %d";
          }
        }
        else {
LAB_00105e23:
          if (5 < (long)uVar6) {
            pcVar9 = (char *)(ulong)config.version;
            if (buffer[0] == config.version) {
              pcVar9 = (char *)(ulong)config.reqcmd;
              if ((buffer[1] == config.reqcmd) && (buffer[2] == '\0')) {
                uVar1 = buffer[3];
                if (buffer[3] == '\x01') {
                  bVar2 = 4;
                }
                else if (buffer[3] == '\x04') {
                  bVar2 = 0x10;
                }
                else {
                  if (buffer[3] != 3) {
                    msg = "Unknown ATYP %d";
                    pcVar9 = (char *)(ulong)(uint)buffer[3];
                    goto LAB_00105a81;
                  }
                  bVar2 = buffer[4] + 1;
                }
                uVar14 = (ulong)bVar2;
                uVar20 = (ulong)(bVar2 + 6);
                if (uVar6 < uVar20) {
                  logmsg("Request too short: %d, expected %d",uVar6,uVar20);
                }
                else {
                  connectport = config.port;
                  if (connectport == 0) {
                    connectport = *(ushort *)(buffer + uVar14 + 4) << 8 |
                                  *(ushort *)(buffer + uVar14 + 4) >> 8;
                  }
                  uVar21 = 0xffffffff;
                  if (config.connectrep == '\0') {
                    uVar21 = socksconnect(connectport,pcVar9);
                  }
                  uVar22 = config.connectrep;
                  if (uVar21 == 0xffffffff) {
                    uVar22 = '\x01';
                  }
                  flag._0_3_ = (uint3)CONCAT11(uVar22,config.responseversion);
                  flag = CONCAT13(uVar1,(uint3)flag);
                  memcpy(local_244,buffer + 4,uVar14);
                  *(undefined2 *)((long)local_244 + uVar14) = *(undefined2 *)(buffer + uVar14 + 4);
                  uVar6 = send(uVar5,&flag,uVar20,0);
                  if (uVar6 != uVar20) {
                    pcVar9 = "Sending connect response failed!";
                    goto LAB_00105c97;
                  }
                  logmsg("Sent %d bytes",uVar20);
                  loghex((uchar *)&flag,uVar20);
                  if (uVar22 == '\0' || uVar21 == 0xffffffff) {
                    uVar21 = -(uint)(uVar22 != '\0') | uVar21;
                    goto LAB_00105c0e;
                  }
                  close(uVar21);
                }
                goto LAB_00105c56;
              }
              msg = "Request COMMAND byte not %d";
            }
            else {
              msg = "Request VERSION byte not %d";
            }
LAB_00105a81:
            logmsg(msg,pcVar9);
            goto LAB_00105c56;
          }
          pcVar9 = "Too short for request: %d";
        }
        logmsg(pcVar9,uVar6);
      }
      else {
        pcVar9 = "Sending response failed!";
LAB_00105c97:
        logmsg(pcVar9);
      }
    }
    else {
      logmsg("Expected %d bytes, got %d",(ulong)buffer[1] + 2,sVar12);
    }
  }
LAB_00105c56:
  logmsg("====> Client disconnect");
  close(uVar5);
LAB_001058bd:
  for (lVar11 = 0x18; lVar11 != 0x58; lVar11 = lVar11 + 0x20) {
    if (*(char *)((long)local_658 + lVar11) == '\x01') {
      iVar3 = *(int *)((long)&local_660 + lVar11 + 4);
      if ((*(ulong *)(&la_size + (long)(iVar3 / 0x40) * 2) >> ((long)iVar3 % 0x40 & 0x3fU) & 1) == 0
         ) {
        iVar17 = *(int *)((long)&local_660 + lVar11);
LAB_0010594a:
        if ((*(ulong *)(&la_size + (long)(iVar17 / 0x40) * 2) >> ((long)iVar17 % 0x40 & 0x3fU) & 1)
            != 0) {
          sVar7 = recv(iVar17,&endptr,0x200,0);
          if (((long)sVar7 < 1) || (sVar13 = send(iVar3,&endptr,sVar7,0), sVar13 != sVar7))
          goto LAB_001059ac;
          *(long *)((long)&local_670 + lVar11) = *(long *)((long)&local_670 + lVar11) + sVar7;
        }
      }
      else {
        sVar7 = recv(iVar3,&endptr,0x200,0);
        if (0 < (long)sVar7) {
          iVar17 = *(int *)((long)&local_660 + lVar11);
          sVar13 = send(iVar17,&endptr,sVar7,0);
          if (sVar13 == sVar7) {
            *(long *)((long)&local_668 + lVar11) = *(long *)((long)&local_668 + lVar11) + sVar7;
            goto LAB_0010594a;
          }
        }
LAB_001059ac:
        logmsg("SOCKS transfer completed. Bytes: < %zu > %zu",
               *(undefined8 *)((long)&local_670 + lVar11),*(undefined8 *)((long)&local_668 + lVar11)
              );
        close(iVar3);
        close(*(int *)((long)&local_660 + lVar11));
        *(undefined1 *)((long)local_658 + lVar11) = 0;
        local_670 = (char *)CONCAT44(local_670._4_4_,(int)local_670 + -1);
      }
    }
  }
  if ((int)local_670 == 0) goto LAB_0010530a;
  goto LAB_00105338;
}

Assistant:

int main(int argc, char *argv[])
{
  curl_socket_t sock = CURL_SOCKET_BAD;
  curl_socket_t msgsock = CURL_SOCKET_BAD;
  int wrotepidfile = 0;
  const char *pidname = ".socksd.pid";
  bool juggle_again;
  int error;
  int arg = 1;

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("socksd IPv4%s\n",
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--pidfile", argv[arg])) {
      arg++;
      if(argc>arg)
        pidname = argv[arg++];
    }
    else if(!strcmp("--config", argv[arg])) {
      arg++;
      if(argc>arg)
        configfile = argv[arg++];
    }
    else if(!strcmp("--backend", argv[arg])) {
      arg++;
      if(argc>arg)
        backendaddr = argv[arg++];
    }
    else if(!strcmp("--backendport", argv[arg])) {
      arg++;
      if(argc>arg)
        backendport = (unsigned short)atoi(argv[arg++]);
    }
    else if(!strcmp("--logfile", argv[arg])) {
      arg++;
      if(argc>arg)
        serverlogfile = argv[arg++];
    }
    else if(!strcmp("--ipv6", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
#endif
      arg++;
    }
    else if(!strcmp("--ipv4", argv[arg])) {
      /* for completeness, we support this option as well */
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
#endif
      arg++;
    }
    else if(!strcmp("--port", argv[arg])) {
      arg++;
      if(argc>arg) {
        char *endptr;
        unsigned long ulnum = strtoul(argv[arg], &endptr, 10);
        if((endptr != argv[arg] + strlen(argv[arg])) ||
           ((ulnum != 0UL) && ((ulnum < 1025UL) || (ulnum > 65535UL)))) {
          fprintf(stderr, "socksd: invalid --port argument (%s)\n",
                  argv[arg]);
          return 0;
        }
        port = curlx_ultous(ulnum);
        arg++;
      }
    }
    else {
      puts("Usage: socksd [option]\n"
           " --backend [ipv4 addr]\n"
           " --backendport [TCP port]\n"
           " --config [file]\n"
           " --version\n"
           " --logfile [file]\n"
           " --pidfile [file]\n"
           " --ipv4\n"
           " --ipv6\n"
           " --bindonly\n"
           " --port [port]\n");
      return 0;
    }
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);

  setmode(fileno(stdin), O_BINARY);
  setmode(fileno(stdout), O_BINARY);
  setmode(fileno(stderr), O_BINARY);
#endif

  install_signal_handlers();

#ifdef ENABLE_IPV6
  if(!use_ipv6)
#endif
    sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef ENABLE_IPV6
  else
    sock = socket(AF_INET6, SOCK_STREAM, 0);
#endif

  if(CURL_SOCKET_BAD == sock) {
    error = SOCKERRNO;
    logmsg("Error creating socket: (%d) %s",
           error, strerror(error));
    goto socks5_cleanup;
  }

  {
    /* passive daemon style */
    sock = sockdaemon(sock, &port);
    if(CURL_SOCKET_BAD == sock) {
      goto socks5_cleanup;
    }
    msgsock = CURL_SOCKET_BAD; /* no stream socket yet */
  }

  logmsg("Running %s version", ipv_inuse);
  logmsg("Listening on port %hu", port);

  wrotepidfile = write_pidfile(pidname);
  if(!wrotepidfile) {
    goto socks5_cleanup;
  }

  do {
    juggle_again = incoming(sock);
  } while(juggle_again);

socks5_cleanup:

  if((msgsock != sock) && (msgsock != CURL_SOCKET_BAD))
    sclose(msgsock);

  if(sock != CURL_SOCKET_BAD)
    sclose(sock);

  if(wrotepidfile)
    unlink(pidname);

  restore_signal_handlers();

  if(got_exit_signal) {
    logmsg("============> socksd exits with signal (%d)", exit_signal);
    /*
     * To properly set the return status of the process we
     * must raise the same signal SIGINT or SIGTERM that we
     * caught and let the old handler take care of it.
     */
    raise(exit_signal);
  }

  logmsg("============> socksd quits");
  return 0;
}